

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

void Wln_RetAddToMoves(Wln_Ret_t *p,Vec_Int_t *vSet,int Delay,int fForward,int nMoves,
                      int fSkipSimple,int fVerbose)

{
  Vec_Int_t *p_00;
  uint Entry;
  uint i;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int i_00;
  
  if (vSet == (Vec_Int_t *)0x0) {
    printf("Move %4d : Recording initial state     (delay = %6d)\n",(ulong)(uint)nMoves,
           (ulong)(uint)Delay);
    Vec_IntPushTwo(&p->vMoves,Delay,0);
    return;
  }
  pcVar3 = "forward ";
  if (fForward == 0) {
    pcVar3 = "backward";
  }
  printf("Move %4d : Recording %s retiming (delay = %6d) :",(ulong)(uint)nMoves,pcVar3,
         (ulong)(uint)Delay);
  p_00 = &p->vMoves;
  Vec_IntPush(p_00,Delay);
  i_00 = 0;
  do {
    if (vSet->nSize <= i_00) {
      Vec_IntPush(p_00,0);
      if (fVerbose == 0) {
        printf(" %3d retimed objects",(ulong)(uint)vSet->nSize);
      }
      putchar(10);
      return;
    }
    i = Vec_IntEntry(vSet,i_00);
    uVar1 = Vec_IntEntry(&p->pNtk->vNameIds,i);
    if (fSkipSimple == 0) {
LAB_0031fed0:
      Entry = -uVar1;
      if (fForward == 0) {
        Entry = uVar1;
      }
      Vec_IntPush(p_00,Entry);
      if (fVerbose != 0) {
        uVar1 = -i;
        if (fForward == 0) {
          uVar1 = i;
        }
        printf(" %d (NameID = %d)  ",(ulong)uVar1,(ulong)Entry);
      }
    }
    else {
      iVar2 = Wln_ObjIsFf(p->pNtk,i);
      if (iVar2 == 0) {
        iVar2 = Vec_IntEntry(&p->pNtk->vTypes,i);
        if (iVar2 != 0x5b) {
          iVar2 = Vec_IntEntry(&p->pNtk->vTypes,i);
          if (iVar2 != 0x5c) goto LAB_0031fed0;
        }
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void Wln_RetAddToMoves( Wln_Ret_t * p, Vec_Int_t * vSet, int Delay, int fForward, int nMoves, int fSkipSimple, int fVerbose )
{
    int i, iObj;
    if ( vSet == NULL )
    {
        printf( "Move %4d : Recording initial state     (delay = %6d)\n", nMoves, Delay );
        Vec_IntPushTwo( &p->vMoves, Delay, 0 );
        return;
    }
    printf( "Move %4d : Recording %s retiming (delay = %6d) :", nMoves, fForward ? "forward " : "backward", Delay );
    Vec_IntPush( &p->vMoves, Delay );
    Vec_IntForEachEntry( vSet, iObj, i )
    {
        int NameId = Vec_IntEntry( &p->pNtk->vNameIds, iObj );
        if ( fSkipSimple && (Wln_ObjIsFf(p->pNtk, iObj) || Wln_ObjType(p->pNtk, iObj) == ABC_OPER_SLICE || Wln_ObjType(p->pNtk, iObj) == ABC_OPER_CONCAT) )
            continue;
        Vec_IntPush( &p->vMoves, fForward ? -NameId : NameId );
        if ( fVerbose )
            printf( " %d (NameID = %d)  ", fForward ? -iObj : iObj, fForward ? -NameId : NameId );
    }
    Vec_IntPush( &p->vMoves, 0 );
    if ( !fVerbose )
        printf( " %3d retimed objects", Vec_IntSize(vSet) );
    printf( "\n" );
}